

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Mat *this_00;
  void *pvVar10;
  char cVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  float *pfVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  ulong __n;
  size_t totalsize;
  bool bVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  void *ptr;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_g;
  long local_1a0;
  ulong local_188;
  undefined1 local_178 [16];
  size_t local_168;
  int local_160;
  Allocator *local_158;
  int local_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  ulong local_140;
  ulong local_138;
  undefined8 uStack_130;
  ulong local_128;
  ulong local_120;
  undefined1 local_118 [40];
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 local_e8 [16];
  Mat *local_d8;
  long local_d0;
  int local_c4;
  ulong local_c0;
  Mat local_b8;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  Option local_58;
  
  uVar21._0_4_ = bottom_blob->h;
  uVar21._4_4_ = bottom_blob->c;
  if ((int)uVar21._4_4_ % this->group != 0) {
    return -100;
  }
  if (this->num_output % this->group != 0) {
    return -100;
  }
  iVar16 = bottom_blob->w;
  local_168 = bottom_blob->elemsize;
  iVar2 = this->kernel_w;
  iVar27 = this->dilation_w;
  iVar15 = this->kernel_h;
  iVar12 = this->dilation_h;
  piVar3 = bottom_blob->refcount;
  local_178._0_8_ = bottom_blob->data;
  local_178._8_8_ = bottom_blob->refcount;
  local_160 = bottom_blob->elempack;
  local_158 = bottom_blob->allocator;
  local_150 = bottom_blob->dims;
  uVar7 = bottom_blob->dims;
  uVar8 = bottom_blob->w;
  local_140 = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  iStack_14c = iVar16;
  iStack_148 = (undefined4)uVar21;
  iStack_144 = uVar21._4_4_;
  local_d8 = top_blob;
  if (local_168 == 1) {
LAB_00152664:
    local_118._16_8_ = 0;
    local_118._24_4_ = 0;
    local_118._0_8_ = (void *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    stack0xffffffffffffff08 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    make_padding(this,(Mat *)local_178,(Mat *)local_118,opt);
    this_00 = local_d8;
    iVar16 = -100;
    if ((void *)local_118._0_8_ != (void *)0x0) {
      if ((long)(int)local_e8._4_4_ * local_e8._8_8_ != 0) {
        iVar20 = iStack_ec;
        iVar2 = (~((iVar2 + -1) * iVar27) + iStack_ec) / this->stride_w;
        uVar25 = (long)(~((iVar15 + -1) * iVar12) + local_e8._0_4_) / (long)this->stride_h;
        __n = (long)this->kernel_h * (long)this->kernel_w;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_b8,__n,(allocator_type *)&local_58);
        pvVar10 = local_b8.data;
        iVar16 = this->kernel_h;
        if (0 < iVar16) {
          iVar27 = this->dilation_h;
          iVar15 = this->kernel_w;
          iVar12 = this->dilation_w * iVar15;
          iVar13 = 0;
          iVar19 = 0;
          iVar23 = 0;
          do {
            if (0 < iVar15) {
              lVar24 = 0;
              do {
                *(int *)((long)local_b8.data + (iVar13 + lVar24) * 4) = iVar19;
                iVar19 = iVar19 + this->dilation_w;
                iVar15 = this->kernel_w;
                lVar24 = lVar24 + 1;
              } while ((int)lVar24 < iVar15);
              iVar13 = iVar13 + (int)lVar24;
              iVar16 = this->kernel_h;
            }
            iVar19 = iVar19 + (iVar20 * iVar27 - iVar12);
            iVar23 = iVar23 + 1;
          } while (iVar23 < iVar16);
        }
        local_128 = uVar25 & 0xffffffff;
        Mat::create(this_00,iVar2 + 1,(int)uVar25 + 1,this->num_output,
                    ((ulong)this->use_int8_requantize ^ 1) * 3 + 1,opt->blob_allocator);
        iVar16 = -100;
        if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar16 = this->group;
          iVar27 = (int)__n;
          if (iVar16 == this->num_output && uVar21._4_4_ == iVar16) {
            if (0 < (int)uVar21._4_4_) {
              local_188 = 0;
              uVar25 = 0;
              uVar21 = local_128;
              do {
                uVar9 = local_118._16_8_;
                uVar6 = local_118._0_8_;
                if (-1 < (int)uVar21) {
                  lVar24 = local_e8._8_8_ * uVar25 * local_118._16_8_;
                  pfVar22 = (float *)(local_d8->cstep * uVar25 * local_d8->elemsize +
                                     (long)local_d8->data);
                  local_d0 = CONCAT44(local_d0._4_4_,iStack_ec);
                  pvVar4 = (this->weight_data).data;
                  uVar14 = 0;
                  local_138 = uVar25;
                  do {
                    local_120 = (ulong)uVar14;
                    if (-1 < iVar2) {
                      iVar15 = uVar14 * (int)local_d0;
                      iVar16 = 0;
                      do {
                        if (iVar27 < 1) {
                          fVar30 = 0.0;
                        }
                        else {
                          uVar21 = 0;
                          iVar12 = 0;
                          do {
                            iVar12 = iVar12 + (int)*(char *)((long)pvVar4 + uVar21 + local_188) *
                                              (int)*(char *)(uVar6 + (long)*(int *)((long)pvVar10 +
                                                                                   uVar21 * 4) +
                                                                     (long)(this->stride_h * iVar15)
                                                                     * uVar9 + (long)iVar16 *
                                                                               (long)this->stride_w
                                                                               + lVar24);
                            uVar21 = uVar21 + 1;
                          } while ((__n & 0xffffffff) != uVar21);
                          fVar30 = (float)iVar12;
                        }
                        fVar1 = *(float *)((long)(this->weight_data_int8_scales).data + uVar25 * 4);
                        if (this->use_int8_requantize == false) {
                          fVar29 = 0.0;
                          if (fVar1 != 0.0) {
                            fVar29 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales)
                                                                     .data + uVar25 * 4));
                          }
                          fVar29 = fVar29 * fVar30;
                          if (this->bias_term != 0) {
                            fVar29 = fVar29 + *(float *)((long)(this->bias_data).data + uVar25 * 4);
                          }
                          fVar30 = 0.0;
                          if (0.0 <= fVar29) {
                            fVar30 = fVar29;
                          }
                          if (this->activation_type != 1) {
                            fVar30 = fVar29;
                          }
                          *pfVar22 = fVar30;
                          lVar17 = 4;
                        }
                        else {
                          fVar29 = 0.0;
                          if (fVar1 != 0.0) {
                            fVar29 = 1.0 / (fVar1 * *(float *)((long)(this->bottom_blob_int8_scales)
                                                                     .data + uVar25 * 4));
                          }
                          fVar29 = fVar29 * fVar30;
                          if (this->bias_term != 0) {
                            fVar29 = fVar29 + *(float *)((long)(this->bias_data).data + uVar25 * 4);
                          }
                          fVar30 = roundf(fVar29 * this->top_blob_int8_scale);
                          iVar12 = (int)fVar30;
                          if (iVar12 < -0x7e) {
                            iVar12 = -0x7f;
                          }
                          if (0x7e < iVar12) {
                            iVar12 = 0x7f;
                          }
                          cVar11 = (char)iVar12;
                          cVar18 = '\0';
                          if ('\0' < cVar11) {
                            cVar18 = cVar11;
                          }
                          if (this->activation_type != 1) {
                            cVar18 = cVar11;
                          }
                          *(char *)pfVar22 = cVar18;
                          lVar17 = 1;
                          uVar25 = local_138;
                        }
                        pfVar22 = (float *)((long)pfVar22 + lVar17);
                        bVar28 = iVar16 != iVar2;
                        iVar16 = iVar16 + 1;
                      } while (bVar28);
                    }
                    uVar14 = (int)local_120 + 1;
                    uVar21 = local_128;
                  } while ((int)local_120 != (int)local_128);
                }
                uVar25 = uVar25 + 1;
                local_188 = local_188 + __n;
              } while ((long)uVar25 < (long)this->group);
            }
          }
          else {
            lVar24 = (long)iVar16;
            if (0 < iVar16) {
              uVar25 = (long)this->num_output / (long)iVar16;
              local_c0 = uVar25 & 0xffffffff;
              iVar12 = (int)((long)(int)uVar21._4_4_ / lVar24);
              iVar15 = (int)uVar25;
              local_c4 = iVar15 * iVar12 * iVar27;
              local_70 = (long)(iVar12 * iVar27);
              local_78 = (long)iVar15;
              local_1a0 = 0;
              do {
                if (0 < (int)local_c0) {
                  local_60 = local_1a0 * local_78;
                  local_68 = (long)(local_c4 * (int)local_1a0);
                  local_188 = 0;
                  do {
                    if (-1 < (int)local_128) {
                      local_120 = local_188 + local_60;
                      pfVar22 = (float *)(local_d8->cstep * local_120 * local_d8->elemsize +
                                         (long)local_d8->data);
                      local_d0 = (long)(this->weight_data).data + local_188 * local_70 + local_68;
                      local_138 = 0;
                      do {
                        if (-1 < iVar2) {
                          iVar16 = 0;
                          do {
                            if (iVar12 < 1) {
                              fVar30 = 0.0;
                            }
                            else {
                              uVar25 = 0;
                              iVar15 = 0;
                              lVar17 = local_d0;
                              do {
                                if (0 < iVar27) {
                                  uVar26 = 0;
                                  do {
                                    iVar15 = iVar15 + (int)*(char *)(lVar17 + uVar26) *
                                                      (int)*(char *)(local_118._0_8_ +
                                                                    (long)*(int *)((long)pvVar10 +
                                                                                  uVar26 * 4) +
                                                                    (uVar25 + (uint)(iVar12 * (int)
                                                  local_1a0)) * local_e8._8_8_ * local_118._16_8_ +
                                                  (long)iVar16 * (long)this->stride_w +
                                                  (long)(iStack_ec * (int)local_138 * this->stride_h
                                                        ) * local_118._16_8_);
                                    uVar26 = uVar26 + 1;
                                  } while ((__n & 0xffffffff) != uVar26);
                                }
                                lVar17 = lVar17 + __n;
                                uVar25 = uVar25 + 1;
                              } while (uVar25 != ((long)(int)uVar21._4_4_ / lVar24 & 0xffffffffU));
                              fVar30 = (float)iVar15;
                            }
                            fVar1 = *(float *)((long)(this->weight_data_int8_scales).data +
                                              local_1a0 * 4);
                            if (this->use_int8_requantize == false) {
                              fVar29 = 0.0;
                              if (fVar1 != 0.0) {
                                fVar29 = 1.0 / (fVar1 * *(float *)((long)(this->
                                                  bottom_blob_int8_scales).data + local_1a0 * 4));
                              }
                              fVar29 = fVar29 * fVar30;
                              if (this->bias_term != 0) {
                                fVar29 = fVar29 + *(float *)((long)(this->bias_data).data +
                                                            local_120 * 4);
                              }
                              fVar30 = 0.0;
                              if (0.0 <= fVar29) {
                                fVar30 = fVar29;
                              }
                              if (this->activation_type != 1) {
                                fVar30 = fVar29;
                              }
                              *pfVar22 = fVar30;
                              lVar17 = 4;
                            }
                            else {
                              fVar29 = 0.0;
                              if (fVar1 != 0.0) {
                                fVar29 = 1.0 / (fVar1 * *(float *)((long)(this->
                                                  bottom_blob_int8_scales).data + local_1a0 * 4));
                              }
                              fVar29 = fVar29 * fVar30;
                              if (this->bias_term != 0) {
                                fVar29 = fVar29 + *(float *)((long)(this->bias_data).data +
                                                            local_120 * 4);
                              }
                              fVar30 = roundf(fVar29 * this->top_blob_int8_scale);
                              iVar15 = (int)fVar30;
                              if (iVar15 < -0x7e) {
                                iVar15 = -0x7f;
                              }
                              if (0x7e < iVar15) {
                                iVar15 = 0x7f;
                              }
                              cVar11 = (char)iVar15;
                              cVar18 = '\0';
                              if ('\0' < cVar11) {
                                cVar18 = cVar11;
                              }
                              if (this->activation_type != 1) {
                                cVar18 = cVar11;
                              }
                              *(char *)pfVar22 = cVar18;
                              lVar17 = 1;
                            }
                            pfVar22 = (float *)((long)pfVar22 + lVar17);
                            bVar28 = iVar16 != iVar2;
                            iVar16 = iVar16 + 1;
                          } while (bVar28);
                        }
                        iVar16 = (int)local_138;
                        local_138 = (ulong)(iVar16 + 1);
                      } while (iVar16 != (int)local_128);
                    }
                    local_188 = local_188 + 1;
                  } while (local_188 != local_c0);
                  iVar16 = this->group;
                }
                local_1a0 = local_1a0 + 1;
              } while (local_1a0 < iVar16);
            }
          }
          iVar16 = 0;
        }
        if (local_b8.data != (void *)0x0) {
          operator_delete(local_b8.data,local_b8.elemsize - (long)local_b8.data);
        }
      }
    }
    piVar3 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
          if ((void *)local_118._0_8_ != (void *)0x0) {
            free((void *)local_118._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)local_118._32_8_ + 0x18))();
        }
      }
    }
  }
  else {
    pAVar5 = opt->workspace_allocator;
    auVar31._0_4_ = -(uint)(uVar7 == 3);
    auVar31._4_4_ = -(uint)(iVar16 == uVar8);
    auVar31._8_4_ = 0xffffffff;
    auVar31._12_4_ = 0xffffffff;
    iVar20 = movmskps((int)piVar3,auVar31);
    if ((((iVar20 == 0xf) && (local_160 == 1)) && (local_158 == pAVar5)) && (local_168 == 1)) {
      if ((void *)local_178._0_8_ != (void *)0x0) {
LAB_00152fdc:
        if ((long)iStack_144 * local_140 != 0) {
          iVar16 = (int)uVar21._4_4_ / this->group;
          if (0 < this->group) {
            lVar17 = 0;
            lVar24 = 0;
            do {
              uVar6._0_1_ = opt->lightmode;
              uVar6._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar6._4_4_ = opt->num_threads;
              local_58.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
              local_58.workspace_allocator._4_4_ =
                   *(undefined4 *)((long)&opt->workspace_allocator + 4);
              local_58.use_winograd_convolution = opt->use_winograd_convolution;
              local_58.use_sgemm_convolution = opt->use_sgemm_convolution;
              local_58.use_int8_inference = opt->use_int8_inference;
              local_58.use_vulkan_compute = opt->use_vulkan_compute;
              local_58.use_fp16_packed = opt->use_fp16_packed;
              local_58.use_fp16_storage = opt->use_fp16_storage;
              local_58.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              local_58.use_int8_storage = opt->use_int8_storage;
              local_58.use_int8_arithmetic = opt->use_int8_arithmetic;
              local_58.use_packing_layout = opt->use_packing_layout;
              local_58.use_shader_pack8 = opt->use_shader_pack8;
              local_58.use_bf16_storage = opt->use_bf16_storage;
              local_58._36_4_ = *(undefined4 *)&opt->field_0x24;
              local_58._0_4_ = SUB84(uVar6,0);
              local_58.num_threads = 1;
              local_58.blob_allocator = local_158;
              local_118._16_8_ = bottom_blob->elemsize;
              local_118._0_8_ =
                   bottom_blob->cstep * lVar17 * local_118._16_8_ + (long)bottom_blob->data;
              local_118._24_4_ = bottom_blob->elempack;
              local_118._8_4_ = 0;
              local_118._12_4_ = 0;
              uStack_f0 = 3;
              local_118._32_8_ = bottom_blob->allocator;
              iStack_ec = bottom_blob->w;
              local_e8._4_4_ = iVar16;
              local_e8._0_4_ = bottom_blob->h;
              local_e8._8_8_ =
                   ((long)(bottom_blob->h * bottom_blob->w) * local_118._16_8_ + 0xfU &
                   0xfffffffffffffff0) / (ulong)local_118._16_8_;
              local_b8.data = (void *)(local_140 * lVar17 * local_168 + local_178._0_8_);
              local_b8.refcount = (int *)0x0;
              local_b8.elemsize = local_168;
              local_b8.elempack = local_160;
              local_b8.allocator = local_158;
              local_b8.dims = 3;
              local_b8.w = iStack_14c;
              local_b8.h = iStack_148;
              local_b8.cstep =
                   ((long)(iStack_148 * iStack_14c) * local_168 + 0xf & 0xfffffffffffffff0) /
                   local_168;
              local_b8.c = iVar16;
              quantize_float32_to_int8
                        ((Mat *)local_118,&local_b8,
                         *(float *)((long)(this->bottom_blob_int8_scales).data + lVar24 * 4),
                         &local_58);
              if (local_b8.refcount != (int *)0x0) {
                LOCK();
                *local_b8.refcount = *local_b8.refcount + -1;
                UNLOCK();
                if (*local_b8.refcount == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) {
                    if (local_b8.data != (void *)0x0) {
                      free(local_b8.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_b8.allocator + 0x18))();
                  }
                }
              }
              piVar3 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if ((Allocator *)local_118._32_8_ == (Allocator *)0x0) {
                    if ((void *)local_118._0_8_ != (void *)0x0) {
                      free((void *)local_118._0_8_);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_118._32_8_ + 0x18))();
                  }
                }
              }
              lVar24 = lVar24 + 1;
              lVar17 = lVar17 + iVar16;
            } while (lVar24 < this->group);
          }
          goto LAB_00152664;
        }
      }
    }
    else {
      uVar25 = uVar21;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_158 == (Allocator *)0x0) {
            if ((void *)local_178._0_8_ != (void *)0x0) {
              uStack_130 = 0;
              local_138 = uVar21;
              free((void *)local_178._0_8_);
              uVar25 = local_138;
            }
          }
          else {
            uStack_130 = 0;
            local_138 = uVar21;
            (**(code **)(*(long *)local_158 + 0x18))();
            uVar25 = local_138;
          }
        }
      }
      local_178 = (undefined1  [16])0x0;
      local_168 = 1;
      local_160 = 1;
      local_150 = 3;
      iStack_148 = (int)uVar25;
      local_140 = (long)(iStack_148 * iVar16) + 0xfU & 0xfffffffffffffff0;
      uVar25 = (long)(int)uVar21._4_4_ * local_140;
      local_158 = pAVar5;
      iStack_14c = iVar16;
      iStack_144 = uVar21._4_4_;
      if (uVar25 != 0) {
        if (pAVar5 == (Allocator *)0x0) {
          local_118._0_8_ = (void *)0x0;
          iVar16 = posix_memalign((void **)local_118,0x10,uVar25 | 4);
          local_178._0_8_ = (void *)0x0;
          if (iVar16 == 0) {
            local_178._0_8_ = local_118._0_8_;
          }
        }
        else {
          local_178._0_8_ = (**(code **)(*(long *)pAVar5 + 0x10))(pAVar5,uVar25 | 4);
        }
        local_178._8_8_ = (void *)(local_178._0_8_ + uVar25);
        *(undefined4 *)(local_178._0_8_ + uVar25) = 1;
        goto LAB_00152fdc;
      }
    }
    iVar16 = -100;
  }
  if ((int *)local_178._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_178._8_8_ = *(int *)local_178._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_178._8_8_ == 0) {
      if (local_158 == (Allocator *)0x0) {
        if ((void *)local_178._0_8_ != (void *)0x0) {
          free((void *)local_178._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)local_158 + 0x18))();
      }
    }
  }
  return iVar16;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

//     fprintf(stderr, "ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        bottom_blob_unbordered.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_unbordered.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_unbordered.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_unbordered.channel_range(channels_g * g, channels_g);

            quantize_float32_to_int8(bottom_blob_g, bottom_blob_int8_g, bottom_blob_int8_scales[g], opt_g);
        }
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[ space_ofs[k] ];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    if (use_int8_requantize)
                    {
                        // requantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        float scale_out = top_blob_int8_scale;//FIXME load param

                        signed char sums8 = float2int8(sumfp32 * scale_out);

                        if (activation_type == 1)
                        {
                            sums8 = std::max(sums8, (signed char)0);
                        }

                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize and relu
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g];

                        if (activation_type == 1)
                        {
                            sumfp32 = std::max(sumfp32, 0.f);
                        }

                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g=0; g<group; g++)
        {
            for (int p=0; p<num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q=0; q<channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[ space_ofs[k] ];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        if (use_int8_requantize)
                        {
                            // requantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            float scale_out = top_blob_int8_scale;//FIXME load param

                            signed char sums8 = float2int8(sumfp32 * scale_out);

                            if (activation_type == 1)
                            {
                                sums8 = std::max(sums8, (signed char)0);
                            }

                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize and relu
                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g * num_output_g + p];

                            if (activation_type == 1)
                            {
                                sumfp32 = std::max(sumfp32, 0.f);
                            }

                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}